

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

size_t al_ustr_encode_utf16(ALLEGRO_USTR *us,uint16_t *s,size_t n)

{
  int32_t c;
  size_t sVar1;
  long lVar2;
  uint16_t encoded [2];
  int pos;
  uint16_t local_44 [2];
  size_t local_40;
  int local_34;
  
  local_34 = 0;
  lVar2 = 0;
  local_40 = n;
  while( true ) {
    local_44[0] = 0;
    local_44[1] = 0;
    c = al_ustr_get_next(us,&local_34);
    if (c < 0) break;
    sVar1 = al_utf16_encode(local_44,c);
    if (n - 2 < sVar1 + lVar2 * 2) break;
    s[lVar2] = local_44[0];
    if (sVar1 == 4) {
      s[lVar2 + 1] = local_44[1];
      lVar2 = lVar2 + 2;
    }
    else {
      lVar2 = lVar2 + 1;
    }
  }
  sVar1 = lVar2 * 2;
  if ((sVar1 | 1) < local_40) {
    s[lVar2] = 0;
    sVar1 = lVar2 * 2 + 2;
  }
  return sVar1;
}

Assistant:

size_t al_ustr_encode_utf16(const ALLEGRO_USTR *us, uint16_t *s,
   size_t n)
{
   int pos = 0;
   size_t i = 0;
   while (1) {
      /* Used to hold one encoded UTF-16 character. */
      uint16_t encoded[2] = {0, 0};
      size_t sz;
      int32_t c = al_ustr_get_next(us, &pos);
      if (c < 0)
         break;
      sz = al_utf16_encode(encoded, c);
      /* Need two bytes for terminating 0. */
      if (i * 2 + sz > n - 2)
         break;
      s[i++] = encoded[0];
      if (sz == 4)
         s[i++] = encoded[1];
   }
   /* Append terminating 0 - al_ustr_get_next withheld it. */
   if (i * 2 + 1 < n)
      s[i++] = 0;

   return i * 2;
}